

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sundials_context.c
# Opt level: O1

int SUNContext_SetLogger(SUNContext sunctx,SUNLogger logger)

{
  int iVar1;
  
  iVar1 = -1;
  if (sunctx != (SUNContext)0x0) {
    if ((sunctx->logger != (SUNLogger)0x0) && (sunctx->own_logger != 0)) {
      iVar1 = SUNLogger_Destroy(&sunctx->logger);
      if (iVar1 != 0) {
        return -1;
      }
      sunctx->logger = (SUNLogger)0x0;
    }
    sunctx->logger = logger;
    sunctx->own_logger = 0;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

int SUNContext_SetLogger(SUNContext sunctx, SUNLogger logger)
{
  if (sunctx == NULL)
  {
    return (-1);
  }

  /* free any existing logger */
  if (sunctx->logger && sunctx->own_logger)
  {
    if (SUNLogger_Destroy(&(sunctx->logger)))
    {
      return (-1);
    }
    sunctx->logger = NULL;
  }

  /* set logger */
  sunctx->logger     = logger;
  sunctx->own_logger = SUNFALSE;

  return (0);
}